

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# taia_add.c
# Opt level: O1

void taia_add(taia *t,taia *u,taia *v)

{
  uint64 uVar1;
  unsigned_long uVar2;
  ulong uVar3;
  
  uVar1 = (v->sec).x + (u->sec).x;
  (t->sec).x = uVar1;
  uVar2 = v->nano + u->nano;
  t->nano = uVar2;
  uVar3 = v->atto + u->atto;
  t->atto = uVar3;
  if (999999999 < uVar3) {
    t->atto = uVar3 - 1000000000;
    t->nano = uVar2 + 1;
  }
  if (999999999 < t->nano) {
    t->nano = t->nano - 1000000000;
    (t->sec).x = uVar1 + 1;
  }
  return;
}

Assistant:

void taia_add(struct taia *t,const struct taia *u,const struct taia *v)
{
  t->sec.x = u->sec.x + v->sec.x;
  t->nano = u->nano + v->nano;
  t->atto = u->atto + v->atto;
  if (t->atto > 999999999UL) {
    t->atto -= 1000000000UL;
    ++t->nano;
  }
  if (t->nano > 999999999UL) {
    t->nano -= 1000000000UL;
    ++t->sec.x;
  }
}